

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::delete_widget(Fl_Widget *wi)

{
  Fl_Widget **__src;
  int iVar1;
  long *plVar2;
  ulong uVar3;
  Fl_Widget **ppFVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  undefined4 extraout_var;
  
  if (wi != (Fl_Widget *)0x0) {
    iVar1 = Fl_Widget::visible_r(wi);
    if (iVar1 != 0) {
      (*wi->_vptr_Fl_Widget[6])(wi);
    }
    iVar1 = (*wi->_vptr_Fl_Widget[8])(wi);
    plVar2 = (long *)CONCAT44(extraout_var,iVar1);
    if ((plVar2 != (long *)0x0) && (plVar2[0x14] != 0)) {
      (**(code **)(*plVar2 + 0x30))(plVar2);
    }
    iVar7 = alloc_dwidgets;
    __src = dwidgets;
    iVar1 = num_dwidgets;
    uVar5 = 0;
    uVar3 = 0;
    if (0 < num_dwidgets) {
      uVar5 = (ulong)(uint)num_dwidgets;
    }
    do {
      if (uVar5 == uVar3) {
        if (alloc_dwidgets <= num_dwidgets) {
          lVar6 = (long)alloc_dwidgets;
          uVar3 = 0xffffffffffffffff;
          if (-0xb < alloc_dwidgets) {
            uVar3 = lVar6 * 8 + 0x50;
          }
          ppFVar4 = (Fl_Widget **)operator_new__(uVar3);
          if (iVar7 == 0) {
            iVar7 = 0;
          }
          else {
            memcpy(ppFVar4,__src,lVar6 << 3);
            if (__src != (Fl_Widget **)0x0) {
              operator_delete__(__src);
              iVar1 = num_dwidgets;
              iVar7 = alloc_dwidgets;
            }
          }
          alloc_dwidgets = iVar7 + 10;
          num_dwidgets = iVar1;
          dwidgets = ppFVar4;
        }
        dwidgets[num_dwidgets] = wi;
        num_dwidgets = num_dwidgets + 1;
        return;
      }
      ppFVar4 = dwidgets + uVar3;
      uVar3 = uVar3 + 1;
    } while (*ppFVar4 != wi);
  }
  return;
}

Assistant:

void Fl::delete_widget(Fl_Widget *wi) {
  if (!wi) return;

  // if the widget is shown(), hide() it (FLTK 1.3.4)
  if (wi->visible_r()) wi->hide();
  Fl_Window *win = wi->as_window();
  if (win && win->shown()) win->hide(); // case of iconified window

  // don't add the same widget twice to the widget delete list
  for (int i = 0; i < num_dwidgets; i++) {
    if (dwidgets[i]==wi) return;
  }

  if (num_dwidgets >= alloc_dwidgets) {
    Fl_Widget	**temp;

    temp = new Fl_Widget *[alloc_dwidgets + 10];
    if (alloc_dwidgets) {
      memcpy(temp, dwidgets, alloc_dwidgets * sizeof(Fl_Widget *));
      delete[] dwidgets;
    }

    dwidgets = temp;
    alloc_dwidgets += 10;
  }

  dwidgets[num_dwidgets] = wi;
  num_dwidgets ++;
}